

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip324.cpp
# Opt level: O3

bool __thiscall
BIP324Cipher::Decrypt
          (BIP324Cipher *this,Span<const_std::byte> input,Span<const_std::byte> aad,bool *ignore,
          Span<std::byte> contents)

{
  Span<std::byte> plain1;
  bool bVar1;
  long in_FS_OFFSET;
  byte header [1];
  byte local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (contents.m_size + 0x11 != input.m_size) {
    __assert_fail("input.size() + LENGTH_LEN == contents.size() + EXPANSION",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/bip324.cpp"
                  ,0x66,
                  "bool BIP324Cipher::Decrypt(Span<const std::byte>, Span<const std::byte>, bool &, Span<std::byte>)"
                 );
  }
  plain1.m_size = 1;
  plain1.m_data = &local_11;
  bVar1 = FSChaCha20Poly1305::Decrypt
                    ((FSChaCha20Poly1305 *)&this->m_recv_p_cipher,input,aad,plain1,contents);
  if (bVar1) {
    *ignore = (bool)(local_11 >> 7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool BIP324Cipher::Decrypt(Span<const std::byte> input, Span<const std::byte> aad, bool& ignore, Span<std::byte> contents) noexcept
{
    assert(input.size() + LENGTH_LEN == contents.size() + EXPANSION);

    std::byte header[HEADER_LEN];
    if (!m_recv_p_cipher->Decrypt(input, aad, header, contents)) return false;

    ignore = (header[0] & IGNORE_BIT) == IGNORE_BIT;
    return true;
}